

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.H
# Opt level: O2

void amrex::average_down_nodal<amrex::IArrayBox>
               (FabArray<amrex::IArrayBox> *fine,FabArray<amrex::IArrayBox> *crse,IntVect *ratio,
               int ngcrse,bool mfiter_is_definitely_safe)

{
  uint nvar;
  int iVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  Periodicity *period;
  int iVar6;
  int iVar7;
  undefined7 in_register_00000081;
  int iVar8;
  undefined8 local_2e0;
  int local_2d8;
  uint local_2d4;
  int local_2d0;
  int local_2cc;
  FabArray<amrex::IArrayBox> *local_2c0;
  FabArray<amrex::IArrayBox> *local_2b8;
  ulong local_2b0;
  IntVect *local_2a8;
  long local_2a0;
  ulong local_298;
  long local_290;
  ulong local_288;
  long local_270;
  long local_268;
  long local_260;
  undefined1 local_258 [24];
  pointer local_240;
  undefined8 uStack_238;
  int local_230;
  BoxArray local_218;
  MFIter mfi;
  
  nvar = (crse->super_FabArrayBase).n_comp;
  if (((int)CONCAT71(in_register_00000081,mfiter_is_definitely_safe) != 0) ||
     (bVar3 = isMFIterSafe(&fine->super_FabArrayBase,&crse->super_FabArrayBase), bVar3)) {
    local_2c0 = fine;
    local_2b8 = crse;
    MFIter::MFIter(&mfi,&crse->super_FabArrayBase,true);
    if ((int)nvar < 1) {
      nvar = 0;
    }
    local_2b0 = (ulong)nvar;
    local_2a8 = ratio;
    while (mfi.currentIndex < mfi.endIndex) {
      MFIter::growntilebox((Box *)&local_2e0,&mfi,ngcrse);
      FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>
                ((Array4<int> *)&local_218,local_2b8,&mfi);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                ((Array4<const_int> *)local_258,local_2c0,&mfi);
      local_288 = (ulong)local_2d4;
      iVar1 = ratio->vect[0];
      local_290 = (long)ratio->vect[1];
      local_2a0 = (long)ratio->vect[2];
      uVar2 = 0;
      while (uVar5 = uVar2, iVar6 = local_2d8, uVar5 != local_2b0) {
        for (; iVar6 <= local_2cc; iVar6 = iVar6 + 1) {
          local_270 = (long)iVar6;
          for (iVar4 = local_2e0._4_4_; iVar4 <= local_2d0; iVar4 = iVar4 + 1) {
            if ((int)local_2e0 <= (int)local_2d4) {
              local_260 = (long)iVar4;
              local_268 = local_260 * local_290;
              iVar7 = (int)local_2e0 * iVar1;
              iVar8 = (int)local_2e0;
              do {
                *(int *)(local_218.m_bat._0_8_ +
                        ((local_260 - local_218.m_bat.m_op.m_bndryReg.m_hishft.vect[0]) *
                         local_218.m_bat.m_op._4_8_ +
                        (long)(iVar8 - local_218.m_bat.m_op._28_4_) +
                        (local_270 - local_218.m_bat.m_op.m_bndryReg.m_hishft.vect[1]) *
                        local_218.m_bat.m_op._12_8_ + local_218.m_bat.m_op._20_8_ * uVar5) * 4) =
                     *(int *)(local_258._0_8_ +
                             ((local_268 - uStack_238._4_4_) * local_258._8_8_ +
                             (long)(iVar7 - (int)uStack_238) +
                             (local_270 * local_2a0 - (long)local_230) * local_258._16_8_ +
                             (long)local_240 * uVar5) * 4);
                iVar8 = iVar8 + 1;
                iVar7 = iVar7 + iVar1;
              } while (local_2d4 + 1 != iVar8);
            }
          }
          ratio = local_2a8;
        }
        local_298 = uVar5;
        uVar2 = uVar5 + 1;
      }
      MFIter::operator++(&mfi);
    }
    MFIter::~MFIter(&mfi);
  }
  else {
    coarsen(&local_218,&(fine->super_FabArrayBase).boxarray,ratio);
    local_258._0_8_ = (int *)0x1;
    local_258._8_8_ = (Arena *)0x0;
    local_258._16_8_ = (pointer)0x0;
    local_240 = (pointer)0x0;
    uStack_238 = (pointer)0x0;
    local_2e0 = &PTR__FabFactory_006d9518;
    FabArray<amrex::IArrayBox>::FabArray
              ((FabArray<amrex::IArrayBox> *)&mfi,&local_218,
               &(fine->super_FabArrayBase).distributionMap,nvar,ngcrse,(MFInfo *)local_258,
               (FabFactory<amrex::IArrayBox> *)&local_2e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_258 + 0x10));
    BoxArray::~BoxArray(&local_218);
    average_down_nodal<amrex::IArrayBox>(fine,(FabArray<amrex::IArrayBox> *)&mfi,ratio,ngcrse,false)
    ;
    period = Periodicity::NonPeriodic();
    FabArray<amrex::IArrayBox>::ParallelCopy
              (crse,(FabArray<amrex::IArrayBox> *)&mfi,0,0,nvar,ngcrse,ngcrse,period,COPY);
    FabArray<amrex::IArrayBox>::~FabArray((FabArray<amrex::IArrayBox> *)&mfi);
  }
  return;
}

Assistant:

void average_down_nodal (const FabArray<FAB>& fine, FabArray<FAB>& crse,
                         const IntVect& ratio, int ngcrse, bool mfiter_is_definitely_safe)
{
    AMREX_ASSERT(fine.is_nodal());
    AMREX_ASSERT(crse.is_nodal());
    AMREX_ASSERT(crse.nComp() == fine.nComp());

    int ncomp = crse.nComp();
    using value_type = typename FAB::value_type;

    if (mfiter_is_definitely_safe || isMFIterSafe(fine, crse))
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(crse,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.growntilebox(ngcrse);
            Array4<value_type> const& crsearr = crse.array(mfi);
            Array4<value_type const> const& finearr = fine.const_array(mfi);

            AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bx, tbx,
            {
                amrex_avgdown_nodes(tbx,crsearr,finearr,0,0,ncomp,ratio);
            });
        }
    }
    else
    {
        FabArray<FAB> ctmp(amrex::coarsen(fine.boxArray(),ratio), fine.DistributionMap(),
                           ncomp, ngcrse);
        average_down_nodal(fine, ctmp, ratio, ngcrse);
        crse.ParallelCopy(ctmp,0,0,ncomp,ngcrse,ngcrse);
    }
}